

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O1

void __thiscall gui::MenuBar::updateMenuBar(MenuBar *this)

{
  float __x;
  undefined4 __x_00;
  pointer pMVar1;
  element_type *peVar2;
  Vector2f VVar3;
  MenuList *menu;
  pointer string;
  float fVar4;
  float fVar5;
  FloatRect FVar6;
  
  string = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (string != pMVar1) {
    peVar2 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    __x = (peVar2->barTextPadding_).x;
    __x_00 = (peVar2->barTextPadding_).y;
    do {
      fVar4 = roundf(__x);
      fVar5 = roundf((float)__x_00);
      VVar3.y = fVar5;
      VVar3.x = fVar4;
      string->labelPosition_ = VVar3;
      sf::Text::setString(&((this->style_).
                            super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->text_,&string->name);
      FVar6 = sf::Text::getLocalBounds
                        (&((this->style_).
                           super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->text_);
      fVar5 = FVar6.width + FVar6.left;
      string->labelWidth_ = fVar5;
      fVar4 = (((this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->barTextPadding_).x;
      __x = __x + fVar4 + fVar4 + fVar5;
      string = string + 1;
    } while (string != pMVar1);
  }
  Widget::requestRedraw(&this->super_Widget);
  return;
}

Assistant:

void MenuBar::updateMenuBar() {
    sf::Vector2f lastLabelPosition(style_->barTextPadding_.x, style_->barTextPadding_.y);
    for (auto& menu : menus_) {
        menu.labelPosition_ = roundVector2f(lastLabelPosition);
        style_->text_.setString(menu.name);
        const auto bounds = style_->text_.getLocalBounds();
        menu.labelWidth_ = bounds.left + bounds.width;
        lastLabelPosition.x += 2.0f * style_->barTextPadding_.x + menu.labelWidth_;
    }
    requestRedraw();
}